

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall TPZDohrSubstruct<float>::TPZDohrSubstruct(TPZDohrSubstruct<float> *this)

{
  TPZSavable *in_RDI;
  TPZAutoPointer<TPZMatrix<float>_> *in_stack_ffffffffffffff10;
  TPZAutoPointer<TPZMatrix<float>_> *in_stack_ffffffffffffff20;
  TPZMatrix<float> *in_stack_ffffffffffffff28;
  TPZManVector<float,_10> *in_stack_ffffffffffffff30;
  TPZFMatrix<float> *in_stack_ffffffffffffff40;
  TPZFMatrix<float> *this_00;
  TPZAutoPointer<TPZMatrix<float>_> *in_stack_ffffffffffffff48;
  TPZSavable *refmat;
  TPZStepSolver<float> *in_stack_ffffffffffffff50;
  TPZStepSolver<float> *this_01;
  
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_025ad388);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZDohrSubstruct_025ad338;
  TPZFMatrix<float>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZFMatrix<float>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  TPZStepSolver<float>::TPZStepSolver(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer(in_stack_ffffffffffffff10);
  TPZFMatrix<float>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x58));
  TPZFMatrix<float>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZFMatrix<float>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZFMatrix<float>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x92));
  TPZManVector<float,_10>::TPZManVector
            (in_stack_ffffffffffffff30,(int64_t)in_stack_ffffffffffffff28);
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(in_stack_ffffffffffffff20);
  TPZFMatrix<float>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0xb2));
  this_01 = (TPZStepSolver<float> *)(in_RDI + 0xb6);
  TPZVec<std::pair<int,_int>_>::TPZVec((TPZVec<std::pair<int,_int>_> *)this_01);
  refmat = in_RDI + 0xba;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  TPZStepSolver<float>::TPZStepSolver(this_01,(TPZAutoPointer<TPZMatrix<float>_> *)refmat);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer(in_stack_ffffffffffffff10);
  this_00 = (TPZFMatrix<float> *)(in_RDI + 0xda);
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  TPZStepSolver<float>::TPZStepSolver(this_01,(TPZAutoPointer<TPZMatrix<float>_> *)refmat);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer(in_stack_ffffffffffffff10);
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  TPZStepSolver<float>::TPZStepSolver(this_01,(TPZAutoPointer<TPZMatrix<float>_> *)refmat);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer(in_stack_ffffffffffffff10);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x11a));
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x11e));
  TPZFMatrix<float>::TPZFMatrix(this_00);
  TPZFMatrix<float>::TPZFMatrix(this_00);
  TPZFMatrix<float>::TPZFMatrix(this_00);
  TPZFMatrix<float>::TPZFMatrix(this_00);
  return;
}

Assistant:

TPZDohrSubstruct<TVar>::TPZDohrSubstruct()
{
	//Inicializacao
}